

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O0

void __thiscall DataServer::readFileAndOutput(DataServer *this)

{
  byte bVar1;
  void *pvVar2;
  ostream *this_00;
  char *buffer;
  ifstream blcokFile;
  __cxx11 local_100 [48];
  __cxx11 local_d0 [32];
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string blockpath;
  DataServer *this_local;
  
  std::__cxx11::to_string(local_d0,this->serverId);
  std::operator+((char *)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "dfsfiles/datanode");
  std::operator+(local_90,(char *)local_b0);
  std::operator+(local_70,local_90);
  std::operator+(local_50,(char *)local_70);
  std::__cxx11::to_string(local_100,read_block);
  std::operator+(local_30,local_50);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)local_d0);
  std::ifstream::ifstream(&buffer,(string *)local_30,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Failed to open block");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    pvVar2 = operator_new__(0x200000);
    std::istream::seekg((long)&buffer,offset_in_block);
    std::istream::read((char *)&buffer,(long)pvVar2);
    std::ostream::write((char *)&std::cout,(long)pvVar2);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&buffer);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void readFileAndOutput() const
    {
        string blockpath = "dfsfiles/datanode" + to_string(serverId) + "/"
        + read_logic_file + "-part" + to_string(read_block);

        ifstream blcokFile(blockpath);

        if (blcokFile.is_open())
        {
            char *buffer = new char[block_size_int];
            blcokFile.seekg(offset_in_block, blcokFile.beg);
            blcokFile.read(buffer, read_count);

            cout.write(buffer, read_count);
            cout << endl;

            delete[] buffer;
            blcokFile.close();
        }
        else
        {
            cerr << "Failed to open block" << endl;
        }
    }